

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_init(char *cfg)

{
  char **groupptr;
  size_t *grouplen_00;
  char cVar1;
  char *pcVar2;
  fsnav_imu *imu;
  fsnav_gnss *pfVar3;
  size_t sVar4;
  fsnav_air *pfVar5;
  fsnav_ref *pfVar6;
  ulong uVar7;
  fsnav_struct *pfVar8;
  ulong uVar9;
  size_t __size;
  char *cfgptr;
  size_t grouplen;
  char multi_gnss_token [9];
  char *local_50;
  size_t local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  pfVar8 = fsnav;
  local_40 = 0x3a5d305b73736e67;
  local_38 = 0;
  __size = 0;
  do {
    pfVar8->cfglength = __size;
    pcVar2 = cfg + __size;
    __size = __size + 1;
  } while (*pcVar2 != '\0');
  pcVar2 = (char *)malloc(__size);
  pfVar8->cfg = pcVar2;
  if (pcVar2 == (char *)0x0) {
    return '\0';
  }
  uVar9 = fsnav->cfglength;
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      fsnav->cfg[uVar7] = cfg[uVar7];
      uVar7 = uVar7 + 1;
      uVar9 = fsnav->cfglength;
    } while (uVar7 < uVar9);
  }
  fsnav->cfg[uVar9] = '\0';
  pfVar8 = fsnav;
  groupptr = &fsnav->cfg_settings;
  grouplen_00 = &fsnav->settings_length;
  fsnav->cfg_settings = (char *)0x0;
  pfVar8->settings_length = 0;
  fsnav_locatecfggroup("",pfVar8->cfg,pfVar8->cfglength,groupptr,grouplen_00);
  pfVar8 = fsnav;
  (fsnav->imu_const).pi = 3.141592653589793;
  (pfVar8->imu_const).rad2deg = 57.29577951308232;
  (pfVar8->imu_const).u = 7.292115e-05;
  (pfVar8->imu_const).a = 6378137.0;
  (pfVar8->imu_const).e2 = 0.0066943800229;
  (pfVar8->imu_const).ge = 9.7803267715;
  (pfVar8->imu_const).fg = 0.005302440112;
  pfVar8->imu = (fsnav_imu *)0x0;
  cVar1 = fsnav_locatecfggroup("imu:",pfVar8->cfg,pfVar8->cfglength,&local_50,&local_48);
  if (cVar1 != '\0') {
    imu = (fsnav_imu *)calloc(1,0x200);
    fsnav->imu = imu;
    if (imu == (fsnav_imu *)0x0) goto LAB_00107844;
    imu->cfg = local_50;
    imu->cfglength = local_48;
    cVar1 = fsnav_init_imu(imu);
    if (cVar1 == '\0') goto LAB_00107844;
  }
  fsnav_init_gnss_const();
  pfVar8 = fsnav;
  fsnav->gnss = (fsnav_gnss *)0x0;
  pfVar8->gnss_count = 0;
  uVar9 = 0;
  do {
    local_40 = CONCAT26(local_40._6_2_,CONCAT15((char)uVar9,(undefined5)local_40)) | 0x300000000000;
    if (((uVar9 == 0) &&
        (cVar1 = fsnav_locatecfggroup("gnss:",fsnav->cfg,fsnav->cfglength,&local_50,&local_48),
        cVar1 != '\0')) ||
       (cVar1 = fsnav_locatecfggroup
                          ((char *)&local_40,fsnav->cfg,fsnav->cfglength,&local_50,&local_48),
       cVar1 != '\0')) {
      if (fsnav->gnss_count <= uVar9) {
        pfVar3 = (fsnav_gnss *)realloc(fsnav->gnss,(uVar9 + 1) * 0x1d8);
        pfVar8 = fsnav;
        if (pfVar3 == (fsnav_gnss *)0x0) goto LAB_00107844;
        fsnav->gnss = pfVar3;
        sVar4 = pfVar8->gnss_count;
        while (sVar4 < uVar9) {
          pfVar8->gnss[sVar4].cfg = (char *)0x0;
          pfVar3 = fsnav->gnss;
          sVar4 = fsnav->gnss_count;
          pfVar3[sVar4].cfglength = 0;
          fsnav_init_gnss(pfVar3 + sVar4);
          pfVar8 = fsnav;
          sVar4 = fsnav->gnss_count + 1;
          fsnav->gnss_count = sVar4;
        }
        pfVar8->gnss_count = uVar9 + 1;
      }
      fsnav->gnss[uVar9].cfg = local_50;
      pfVar3 = fsnav->gnss;
      pfVar3[uVar9].cfglength = local_48;
      cVar1 = fsnav_init_gnss(pfVar3 + uVar9);
      if (cVar1 == '\0') goto LAB_00107844;
    }
    pfVar8 = fsnav;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 10);
  fsnav->air = (fsnav_air *)0x0;
  cVar1 = fsnav_locatecfggroup("air:",pfVar8->cfg,pfVar8->cfglength,&local_50,&local_48);
  if (cVar1 != '\0') {
    pfVar5 = (fsnav_air *)calloc(1,0x60);
    fsnav->air = pfVar5;
    if (pfVar5 == (fsnav_air *)0x0) goto LAB_00107844;
    pfVar5->cfg = local_50;
    pfVar5->cfglength = local_48;
    pfVar5->vv = 0.0;
    pfVar5->speed = 0.0;
    pfVar5->t = 0.0;
    pfVar5->alt = 0.0;
    pfVar5->alt_std = -1.0;
    pfVar5->vv_std = -1.0;
    pfVar5->speed_std = -1.0;
    pfVar5->alt_valid = '\0';
    pfVar5->vv_valid = '\0';
    pfVar5->speed_valid = '\0';
  }
  pfVar8 = fsnav;
  fsnav->ref = (fsnav_ref *)0x0;
  cVar1 = fsnav_locatecfggroup("ref:",pfVar8->cfg,pfVar8->cfglength,&local_50,&local_48);
  if (cVar1 != '\0') {
    pfVar6 = (fsnav_ref *)calloc(1,0x160);
    pfVar8 = fsnav;
    fsnav->ref = pfVar6;
    if (pfVar6 == (fsnav_ref *)0x0) goto LAB_00107844;
    pfVar6->cfg = local_50;
    pfVar6->cfglength = local_48;
    pfVar6->t = 0.0;
    pfVar6->g[0] = 0.0;
    pfVar6->g[1] = 0.0;
    pfVar6->g[2] = ((pfVar8->imu_const).fg * 0.5 + 1.0) * -(pfVar8->imu_const).ge;
    pfVar6->g_valid = '\0';
    cVar1 = fsnav_init_sol(&pfVar6->sol,local_50,local_48);
    if (cVar1 == '\0') goto LAB_00107844;
  }
  cVar1 = fsnav_init_sol(&fsnav->sol,fsnav->cfg_settings,fsnav->settings_length);
  pfVar8 = fsnav;
  if (cVar1 != '\0') {
    fsnav->t = 0.0;
    pfVar8->mode = 0;
    return '\x01';
  }
LAB_00107844:
  fsnav_free();
  return '\0';
}

Assistant:

char fsnav_init(char* cfg)
{
	const size_t max_gnss_count = 10; // maximum number of gnss receiver data structures

	char multi_gnss_token[] = "gnss[0]:";
	const size_t multi_gnss_index_position = 5;

	size_t grouplen;
	char* cfgptr;

	fsnav_gnss* reallocated_pointer;

	size_t i;

	// determine configuration string length
	for (fsnav->cfglength = 0; cfg[fsnav->cfglength]; fsnav->cfglength++);

	// assign configuration string
	fsnav->cfg = (char*)malloc(sizeof(char)*(fsnav->cfglength+1));
	if (fsnav->cfg == NULL)
		return 0;
	for (i = 0; i < fsnav->cfglength; i++)
		fsnav->cfg[i] = cfg[i];
	fsnav->cfg[fsnav->cfglength] = '\0';

	// fetch a part of configuration that is outside of any group
	fsnav->cfg_settings = NULL;
	fsnav->settings_length = 0;
	fsnav_locatecfggroup("", fsnav->cfg, fsnav->cfglength, &fsnav->cfg_settings, &fsnav->settings_length);

	// imu init
	fsnav_init_imu_const();
	fsnav->imu = NULL;
	if (fsnav_locatecfggroup("imu:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try to allocate memory
		fsnav->imu = (fsnav_imu*)calloc(1, sizeof(fsnav_imu));
		if (fsnav->imu == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->imu->cfg = cfgptr;
		fsnav->imu->cfglength = grouplen;

		// try to init
		if (!fsnav_init_imu(fsnav->imu)) {
			fsnav_free();
			return 0;
		}
	}

	// gnss init
	fsnav_init_gnss_const();
	fsnav->gnss = NULL;
	fsnav->gnss_count = 0;
	// multiple gnss mode support
	for (i = 0; i < max_gnss_count; i++) {
		multi_gnss_token[multi_gnss_index_position] = '0' + (char)i;

		if ((i == 0 && fsnav_locatecfggroup("gnss:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) ||
		     fsnav_locatecfggroup(multi_gnss_token, fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) {
			if (i >= fsnav->gnss_count) {
				// try to allocate/reallocate memory
				reallocated_pointer = (fsnav_gnss*)realloc(fsnav->gnss, sizeof(fsnav_gnss)*(i+1));
				if (reallocated_pointer == NULL) {
					fsnav_free();
					return 0;
				}
				else
					fsnav->gnss = reallocated_pointer;
				// try to init new instances, except the i-th one
				for (; fsnav->gnss_count < i; fsnav->gnss_count++) {
					fsnav->gnss[fsnav->gnss_count].cfg = NULL;
					fsnav->gnss[fsnav->gnss_count].cfglength = 0;
					fsnav_init_gnss(&(fsnav->gnss[fsnav->gnss_count]));
				}
				fsnav->gnss_count = i+1;
			}

			// set configuration pointer
			fsnav->gnss[i].cfg = cfgptr;
			fsnav->gnss[i].cfglength = grouplen;

			// try to init
			if (!fsnav_init_gnss(&(fsnav->gnss[i]))) {
				fsnav_free();
				return 0;
			}
		}
	}

	// air data init
	fsnav->air = NULL;
	if (fsnav_locatecfggroup("air:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try to allocate memory
		fsnav->air = (fsnav_air*)calloc(1, sizeof(fsnav_air));
		if (fsnav->air == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->air->cfg = cfgptr;
		fsnav->air->cfglength = grouplen;

		// try to init
		if (!fsnav_init_air(fsnav->air)) {
			fsnav_free();
			return 0;
		}
	}

	// reference data init
	fsnav->ref = NULL;
	if (fsnav_locatecfggroup("ref:", fsnav->cfg, fsnav->cfglength, &cfgptr, &grouplen)) { // if the group found in configuration
		// try lo allocate memory
		fsnav->ref = (fsnav_ref*)calloc(1, sizeof(fsnav_ref));
		if (fsnav->ref == NULL) {
			fsnav_free();
			return 0;
		}

		// set configuration pointer
		fsnav->ref->cfg = cfgptr;
		fsnav->ref->cfglength = grouplen;

		// try to init
		if(!fsnav_init_ref(fsnav->ref)) {
			fsnav_free();
			return 0;
		}
	}

	// solution
	if (!fsnav_init_sol(&(fsnav->sol), fsnav->cfg_settings, fsnav->settings_length)) {
		fsnav_free();
		return 0;
	}

	// system time, operation mode
	fsnav->t = 0;
	fsnav->mode = 0;
	return 1;
}